

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::GetMotorCurrent(AmpIO *this,uint index,double *amps)

{
  uint uVar1;
  
  uVar1 = this->NumMotors;
  if (index < uVar1) {
    *amps = (double)(ushort)this->ReadBuffer[index + 4] * 0.00019073486328125 + -6.25;
  }
  return index < uVar1;
}

Assistant:

bool AmpIO::GetMotorCurrent(unsigned int index, double &amps) const
{
    if (index >= NumMotors)
        return false;
    uint32_t bits = GetMotorCurrent(index);
    const double Bits2AmpsQLA = (2.5*5.0/65536);
    amps = bits*Bits2AmpsQLA - 6.25;
    return true;
}